

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O1

char * __thiscall FHistory::Trim_filename(FHistory *this,char *s,int stops)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  
  sVar2 = strlen(s);
  bVar5 = stops != 0;
  pcVar3 = s + (int)sVar2;
  pcVar4 = s + (long)(int)sVar2 + -1;
  pcVar1 = s + (long)(int)sVar2 + -1;
  if (bVar5) {
    do {
      pcVar4 = pcVar1;
      if (pcVar1 <= s) break;
      if ((*pcVar1 == '\\') || (*pcVar1 == '/')) {
        stops = stops + -1;
      }
      pcVar4 = pcVar1 + -1;
      bVar5 = stops != 0;
      pcVar3 = pcVar1;
      pcVar1 = pcVar4;
    } while (bVar5);
  }
  pcVar3 = pcVar3 + 1;
  if (bVar5) {
    pcVar3 = pcVar4;
  }
  return pcVar3;
}

Assistant:

char *FHistory::Trim_filename(char *s, int stops) {

	int l   = strlen(s);
	char *p = s + l - 1;

	while ((stops) && (p > s)) {
		if ((*p == '/') || (*p == '\\')) stops--;
		p--;
	}
	if (!stops) p += 2;

	return p;
}